

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

atom * updateHydrogenInfo(FILE *outf,atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,
                         atomBins *bbins,int selectedFlag,int mustSaveMainWater)

{
  int iVar1;
  atom *__dest;
  bool bVar2;
  float fVar3;
  undefined8 in_stack_fffffffffffffda0;
  undefined4 uVar6;
  char *pcVar4;
  undefined8 uVar5;
  atom *local_250;
  double local_240;
  double local_238;
  double local_230;
  float local_220;
  float local_21c;
  atom *local_218;
  bool local_209;
  double waterOHbondLen;
  point3d o2aVec;
  int foundAromRingAtom;
  float hbgap;
  atom *waterClone;
  anon_struct_16_2_fa5d6e3e proximity [20];
  int local_8c;
  uint local_88;
  int dummy;
  int usesMovingAtoms;
  int nProx;
  int whichList;
  int i;
  int newHcount;
  int type;
  atom *mainWaterStorage;
  atom *tempStaticList;
  atom *newH;
  atom *a;
  atom *atomList;
  atom *orig;
  atom *src;
  atom *paStack_30;
  int selectedFlag_local;
  atomBins *bbins_local;
  atom *allMovingAtoms_local;
  atomBins *abins_local;
  atom *allMainAtoms_local;
  FILE *outf_local;
  
  orig = (atom *)0x0;
  atomList = (atom *)0x0;
  a = (atom *)0x0;
  newH = (atom *)0x0;
  tempStaticList = (atom *)0x0;
  mainWaterStorage = (atom *)0x0;
  _newHcount = (atom *)0x0;
  i = 0;
  whichList = 0;
  nProx = 0;
  usesMovingAtoms = 0;
  dummy = 0;
  local_8c = 0;
  local_209 = allMovingAtoms != (atom *)0x0 && bbins != (atomBins *)0x0;
  local_88 = (uint)local_209;
  paStack_30 = (atom *)bbins;
  bbins_local = (atomBins *)allMovingAtoms;
  if (local_88 == 0) {
    bbins_local = (atomBins *)0x0;
    paStack_30 = (atom *)0x0;
  }
  src._4_4_ = selectedFlag;
  allMovingAtoms_local = (atom *)abins;
  abins_local = (atomBins *)allMainAtoms;
  allMainAtoms_local = (atom *)outf;
  if (DumpNewHO != 0) {
    fprintf((FILE *)outf,"@vectorlist {water H?} color= gray\n");
  }
  mainWaterStorage = (atom *)0x0;
  _newHcount = (atom *)0x0;
  usesMovingAtoms = 0;
  do {
    if (1 < usesMovingAtoms) {
      if (mainWaterStorage != (atom *)0x0) {
        for (orig = (atom *)bbins_local; orig != (atom *)0x0; orig = orig->next) {
          if (orig->next == (atom_t *)0x0) {
            orig->next = mainWaterStorage;
            return _newHcount;
          }
        }
      }
      return _newHcount;
    }
    if (usesMovingAtoms == 0) {
      local_218 = (atom *)abins_local;
    }
    else {
      local_218 = (atom *)bbins_local;
    }
    for (orig = local_218; orig != (atom *)0x0; orig = orig->next) {
      iVar1 = getAtno(orig->elem);
      if (iVar1 == 1) {
        a = (atom *)0x0;
        if (((orig->flags & src._4_4_) != 0) &&
           (a = findTouchingAtoms(orig,(atom *)0x0,(atomBins *)allMovingAtoms_local,0.0,0,&local_8c)
           , local_88 != 0)) {
          a = findTouchingAtoms(orig,a,(atomBins *)paStack_30,0.0,0,&local_8c);
        }
        if (a != (atom *)0x0) {
          markBonds(orig,a,1,1);
          i = dotType(orig,a,ByNABaseColor);
          if (((i == 8) || (i == 9)) || (i == 0xb)) {
            if ((Verbose != 0) && (ShowTicks != 0)) {
              fprintf(_stderr,"%s%d   \r",orig->r->resname,(ulong)(uint)orig->r->resid);
            }
            orig->props = orig->props | 0x10000;
            if (UsePolarH != 0) {
              orig->elem = 4;
              fVar3 = getRadius(orig->elem,0);
              orig->radius = fVar3;
            }
            if (0.0 <= orig->occ) {
              local_21c = orig->occ;
            }
            else {
              local_21c = -orig->occ;
            }
            if (((local_21c < 0.25) || (80.0 <= orig->bval)) && ((orig->props & 0x400U) != 0)) {
              orig->elem = 1;
              orig->radius = 0.0;
            }
            for (newH = a; newH != (atom *)0x0; newH = newH->scratch) {
              if ((newH->mark == 1) && (iVar1 = getAtno(newH->elem), iVar1 != 1)) {
                if (0.0 <= orig->occ) {
                  local_220 = orig->occ;
                }
                else {
                  local_220 = -orig->occ;
                }
                if ((0.25 <= local_220) && (orig->bval < 80.0)) {
                  newH->props = newH->props & 0xfffeffff;
                }
              }
            }
          }
        }
      }
      else if ((((orig->flags & src._4_4_) == 0) || ((orig->props & 0x400U) == 0)) ||
              (orig->elem != 9)) {
        if ((((orig->flags & src._4_4_) != 0) && ((orig->props & 0x400U) == 0)) &&
           ((orig->elem == 8 || ((orig->elem == 9 || (orig->elem == 0xb)))))) {
          orig->props = orig->props & 0xfffeffff;
        }
      }
      else {
        if ((orig->props & 0x10000U) != 0) {
          newH = orig->next;
          while( true ) {
            bVar2 = false;
            if (newH != (atom *)0x0) {
              bVar2 = orig->r == newH->r;
            }
            if (!bVar2) break;
            iVar1 = getAtno(newH->elem);
            if (((iVar1 == 1) && (orig->altConf == newH->altConf)) && (0.1 < newH->occ)) {
              orig->props = orig->props & 0xfffeffff;
            }
            newH = newH->next;
          }
        }
        if ((orig->props & 0x10000U) != 0) {
          if (((mustSaveMainWater != 0) && (local_88 != 0)) &&
             ((usesMovingAtoms == 0 && (__dest = (atom *)malloc(0x80), __dest != (atom *)0x0)))) {
            memcpy(__dest,orig,0x80);
            __dest->next = _newHcount;
            _newHcount = __dest;
          }
          orig->props = orig->props | 0x10000000;
          orig->props = orig->props | 0x20000;
          orig->props = orig->props & 0xfffeffff;
          atomList = orig;
          a = findTouchingAtoms(orig,(atom *)0x0,(atomBins *)allMovingAtoms_local,0.25,0,&local_8c);
          if (local_88 != 0) {
            a = findTouchingAtoms(orig,a,(atomBins *)paStack_30,0.25,0,&local_8c);
          }
          dummy = 0;
          for (newH = a; newH != (atom *)0x0; newH = newH->scratch) {
            if ((newH->props & 0x20000U) != 0) {
              o2aVec.z._4_4_ = gapSize(&newH->loc,&atomList->loc,newH->radius + 2.0);
              o2aVec.z._0_4_ = 0;
              if ((newH->props & 0x40000U) != 0) {
                for (nProx = 0; nProx < dummy; nProx = nProx + 1) {
                  if ((newH->r == *(residue_t **)(*(long *)&proximity[(long)nProx + -1].gap + 0x70))
                     && ((*(uint *)(*(long *)&proximity[(long)nProx + -1].gap + 0x28) & 0x40000) !=
                         0)) {
                    if (o2aVec.z._4_4_ < *(float *)&proximity[nProx].a) {
                      *(atom **)&proximity[(long)nProx + -1].gap = newH;
                      *(float *)&proximity[nProx].a = o2aVec.z._4_4_;
                    }
                    o2aVec.z._0_4_ = 1;
                    break;
                  }
                }
              }
              if ((o2aVec.z._0_4_ == 0) && ((uint)dummy < 0x14)) {
                *(atom **)&proximity[(long)dummy + -1].gap = newH;
                *(float *)&proximity[dummy].a = o2aVec.z._4_4_;
                dummy = dummy + 1;
              }
            }
          }
          whichList = 0;
          for (nProx = 0; nProx < dummy; nProx = nProx + 1) {
            newH = *(atom **)&proximity[(long)nProx + -1].gap;
            if (((*(atom **)&proximity[(long)nProx + -1].gap)->props & 0x20000U) != 0) {
              tempStaticList = (atom *)malloc(0x80);
              if (tempStaticList != (atom *)0x0) {
                memcpy(tempStaticList,atomList,0x80);
                if (local_88 == 0) {
                  tempStaticList->next = orig->next;
                  orig->next = tempStaticList;
                }
                else {
                  tempStaticList->next = mainWaterStorage;
                  mainWaterStorage = tempStaticList;
                }
                v3sub((vector3d *)&newH->loc,(vector3d *)&atomList->loc,(vector3d *)&waterOHbondLen)
                ;
                if (*(float *)&proximity[nProx].a + 0.6 <= 0.0) {
                  local_230 = (double)*(float *)&proximity[nProx].a + 0.6;
                }
                else {
                  local_230 = 0.0;
                }
                if (-1.0 <= local_230) {
                  if (*(float *)&proximity[nProx].a + 0.6 <= 0.0) {
                    local_240 = (double)*(float *)&proximity[nProx].a + 0.6;
                  }
                  else {
                    local_240 = 0.0;
                  }
                  local_238 = local_240;
                }
                else {
                  local_238 = -1.0;
                }
                v3scale((vector3d *)&waterOHbondLen,local_238 + 1.0);
                v3add((vector3d *)&atomList->loc,(vector3d *)&waterOHbondLen,
                      (vector3d *)&tempStaticList->loc);
                tempStaticList->nextInBin = (atom_t *)0x0;
                tempStaticList->scratch = (atom_t *)0x0;
                tempStaticList->elem = 5;
                fVar3 = getRadius(tempStaticList->elem,0);
                tempStaticList->radius = fVar3;
                fVar3 = getCovRad(tempStaticList->elem);
                tempStaticList->covRad = fVar3;
                strcpy(tempStaticList->atomname," H? ");
                tempStaticList->props = tempStaticList->props | 0x10000;
                tempStaticList->props = tempStaticList->props & 0xfffdffff;
                if (local_88 == 0) {
                  local_250 = allMovingAtoms_local;
                }
                else {
                  local_250 = paStack_30;
                }
                addNeighbor(tempStaticList,(atomBins *)local_250);
                uVar6 = (undefined4)((ulong)in_stack_fffffffffffffda0 >> 0x20);
                if (DumpNewHO != 0) {
                  if (3 < DebugLevel) {
                    whichList = whichList + 1;
                    pcVar4 = tempStaticList->r->Hy36resno;
                    fprintf(_stderr,
                            "HETATM%5d  H%-2d%c%3.3s%s%4.4s%c   %8.3f%8.3f%8.3f%6.2f%6.2f      new  H\n"
                            ,(tempStaticList->loc).x,(tempStaticList->loc).y,(tempStaticList->loc).z
                            ,(double)tempStaticList->occ,(double)tempStaticList->bval,0,
                            (ulong)(uint)whichList,(ulong)(uint)(int)tempStaticList->altConf,
                            tempStaticList->r->resname,tempStaticList->r->chain,pcVar4,
                            (int)tempStaticList->r->resInsCode);
                    uVar6 = (undefined4)((ulong)pcVar4 >> 0x20);
                  }
                  uVar5 = CONCAT44(uVar6,(int)atomList->r->resInsCode);
                  fprintf((FILE *)allMainAtoms_local,"{%4.4s%c%3.3s%s%4.4s%c}P %8.3f%8.3f%8.3f\n",
                          (atomList->loc).x,(atomList->loc).y,(atomList->loc).z,atomList->atomname,
                          (ulong)(uint)(int)atomList->altConf,atomList->r->resname,
                          atomList->r->chain,atomList->r->Hy36resno,uVar5);
                  in_stack_fffffffffffffda0 =
                       CONCAT44((int)((ulong)uVar5 >> 0x20),(int)tempStaticList->r->resInsCode);
                  fprintf((FILE *)allMainAtoms_local,"{%4.4s%c%3.3s%s%4s%c}L %8.3f%8.3f%8.3f\n",
                          (tempStaticList->loc).x,(tempStaticList->loc).y,(tempStaticList->loc).z,
                          tempStaticList->atomname,(ulong)(uint)(int)tempStaticList->altConf,
                          tempStaticList->r->resname,tempStaticList->r->chain,
                          tempStaticList->r->Hy36resno,in_stack_fffffffffffffda0);
                }
                if (local_88 == 0) {
                  orig = orig->next;
                }
              }
            }
          }
        }
      }
    }
    usesMovingAtoms = usesMovingAtoms + 1;
  } while( true );
}

Assistant:

atom* updateHydrogenInfo(FILE *outf, atom *allMainAtoms,   atomBins *abins,
                    atom *allMovingAtoms, atomBins *bbins,
                    int selectedFlag, int mustSaveMainWater)
{/*updateHydrogenInfo*/
   atom *src = NULL, *orig = NULL, *atomList = NULL, *a = NULL;
   atom *newH = NULL, *tempStaticList = NULL, *mainWaterStorage = NULL;
   int type = 0, newHcount = 0, i = 0, whichList = 0;
   int nProx = 0, usesMovingAtoms = FALSE;
   int dummy = FALSE;

   /* Information specific to making sure only one H2O Hydrogen is     */
   /* generated which points into ring atoms on a given aromatic ring. */
   struct {atom  *a; float gap;} proximity[20];

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));
   if (! usesMovingAtoms) { allMovingAtoms = NULL; bbins = NULL; }

   if (DumpNewHO) { fprintf(outf,"@vectorlist {water H?} color= gray\n"); }

   tempStaticList = NULL; /* new hydrogens for MainAtoms when usesMovingAtoms */
   mainWaterStorage = NULL; /* MainAtoms waters when usesMovingAtoms          */

   for(whichList = 0; whichList <= 1; whichList++)
   { /* loop over both lists of atoms */
      for(src = ((whichList==0)?allMainAtoms:allMovingAtoms); src; src = src->next)
      {/*loop over src atoms*/

         /* Note: we have to examine ALL the atoms at this point.        */
         /* Not testing (src->flags & selectedFlag) for H will slow down */
         /* the code but it is neccessary to get the atom types correct. */

         if (isHatom(src->elem))
         { /* fixup Hs in the input */

            atomList = NULL;
            if (src->flags & selectedFlag)
            {
               atomList = findTouchingAtoms(src, NULL, abins, 0.0, 0, &dummy);
               if (usesMovingAtoms)
               {
                  atomList = findTouchingAtoms(src, atomList, bbins, 0.0, 0, &dummy);
               }
            }
            if (atomList)
            {
               markBonds(src, atomList, 1, 1); /*in updateHydrogenInfo()*/
               type = dotType(src, atomList, ByNABaseColor);

               if ( type == atomN || type == atomO || type == atomS )
               {/* bgn: if (atom types) */
                  if(Verbose && ShowTicks)
                  {
                     fprintf(stderr, "%s%d   \r",src->r->resname, src->r->resid);
                  }
                  src->props |= DONOR_PROP; /* polar hydrogens are donors */

                  if (UsePolarH)
                  {
                     src->elem = atomHpolar; /* very important */
                     src->radius = getRadius(src->elem, 0);
                  }
/* there are a more restrictive set of cutoffs in reduce: 0.7 & 40 */
#define H2OoccCUTTOFF   0.25
#define H2ObvalCUTTOFF 80.0
                  if (  (   FABS(src->occ) < H2OoccCUTTOFF
                         || src->bval >= H2ObvalCUTTOFF   )
                      &&(src->props & WATER_PROP)          )
                  {
                     src->elem = ignoreAtom;
                     src->radius = 0.0;
                  } /* ignore low occupancy High B water hydrogens */

                  for(a = atomList; a; a = a->scratch)
                  {
                     /* since we found a hydrogen, then we know */
                     /* that the heavy atom is not the donor    */
                     /* so we can disable that property         */
                     if(    (a->mark == 1)
                        && !(isHatom(a->elem))
                        &&  (FABS(src->occ) >= H2OoccCUTTOFF)
                        &&  (src->bval < H2ObvalCUTTOFF)     )
                     {

                        a->props &= ~DONOR_PROP; /*set to one's complement of ...*/
                     }
                  }
               }/* end: if (atom types) */
            }
         }/* fixup Hs in the input */
         else if (   (src->flags & selectedFlag)  /* fixup water oxygen */
                  && (src->props & WATER_PROP)
                  && (src->elem == atomO)       )
         {/* else if water */ /* fixup water oxygen */

            /*if connected H already found, the DONOR prop will not be set*/
            /*if it is, we look further ahead in this residue for Hs      */
            if (src->props & DONOR_PROP)
            {
               for(a = src->next; a && (src->r == a->r); a = a->next)
               {
                  if (  isHatom(a->elem)
                      && (src->altConf == a->altConf)
                      && (a->occ > 0.1))
                  {
                     src->props &= ~DONOR_PROP; /* turn off donor property */
                  }
               }
            }
            /* if donor flag still set...  */
            if (src->props & DONOR_PROP)
            {/* water O without occupied Hs */

               /* begin clone procedure */
               /* special case for when we want to remember just these waters */
               /* in this state                                               */
               if (mustSaveMainWater && usesMovingAtoms && (whichList==0))
               {
                  atom* waterClone = NULL;
                  waterClone = (atom *)malloc(sizeof(atom));
                  if (waterClone)
                  {
                     *waterClone = *src;
                     waterClone->next = mainWaterStorage; /* add clone to list */
                     mainWaterStorage = waterClone;
                  }
               }
               /* end clone procedure */

               src->props |= AMBIGWATER_PROP; /* this is a water which needs H? added */
               src->props |=  ACCEPTOR_PROP;
               src->props &= ~DONOR_PROP;    /* acceptor, not donor */
               orig = src; /* keep track of the original Oxygen atom */
               atomList = findTouchingAtoms(src, NULL, abins, 0.25, 0, &dummy);
               if (usesMovingAtoms)
               {
                  atomList = findTouchingAtoms(src, atomList, bbins, 0.25, 0, &dummy);
               }
               /* the 0.25 comes from:
                  OxygenVDW(1.4) + 2*probeRad(0.3) == HpolVDW(1.0) + OHBondLen(1.0)
                  and we want a minimum overlap of 0.1 before we consider possible Hs
               */

              /* for each nearby HB acceptor, keep only 1 per aromatic ring */
              nProx = 0;
              for(a = atomList; a; a = a->scratch)
              {
                 if (a->props & ACCEPTOR_PROP)
                 {/* bgn: if acceptor_prop */
                    float hbgap = gapSize(&(a->loc), &(orig->loc), a->radius + 2.0f);
                    int   foundAromRingAtom = FALSE;

                    if (a->props & AROMATIC_PROP)
                    {
                       for (i=0; i < nProx; i++)
                       {
                          if (   a->r == proximity[i].a->r
                              && proximity[i].a->props & AROMATIC_PROP)
                          {

                             if (hbgap < proximity[i].gap)
                             {
                                proximity[i].a = a;
                                proximity[i].gap = hbgap;
                             }
                             foundAromRingAtom = TRUE;
                             break;
                          }
                       }
                    }
                    if (   (!foundAromRingAtom)
                        && nProx < sizeof(proximity)/sizeof(proximity[0]))
                    {
                       proximity[nProx].a = a;
                       proximity[nProx].gap  = hbgap;
                       ++nProx;
                    }
                 }/* end: if acceptor_prop */
              }

              /* build new HOH hydrogens in the direction of each acceptor */
              newHcount = 0;
              for (i=0; i < nProx; i++)
              {/*scan over neighbors*/

                 a = proximity[i].a;

                 if (a->props & ACCEPTOR_PROP)
                 {/*close acceptor! Make a phantom H in the direction of each Acceptor*/
                    newH = (atom *)malloc(sizeof(atom));
                    if (newH)
                    {/*newH allocated, set its parameters*/
                       point3d o2aVec;
                       double waterOHbondLen;

                       *newH = *orig;
                       if (usesMovingAtoms)
                       {
                          newH->next = tempStaticList; /* hook into temp list */
                          tempStaticList = newH;
                       }
                       else
                       {
                          newH->next = src->next; /* hook into list of atoms */
                          src->next  = newH;
                       }

                       v3sub(&(a->loc), &(orig->loc), &o2aVec);
#define BEST_HBOND_OVERLAP 0.6
                       waterOHbondLen = 1.0 +
                       MAX(-1.0, MIN(0.0, proximity[i].gap + BEST_HBOND_OVERLAP));
                       v3scale(&o2aVec, waterOHbondLen);
                       v3add(&(orig->loc), &o2aVec, &(newH->loc));

                       newH->nextInBin= NULL; /* added to bins below */
                       newH->scratch  = NULL;
                       newH->elem     = atomHOd; /*hb-only-dummy, phantom H atom*/
                       newH->radius   = getRadius(newH->elem, 0);
                       newH->covRad   = getCovRad(newH->elem);
                          /*atomprops.h/atomProp AtomTbl covRad*/
                       strcpy(newH->atomname, " H? ");

                       newH->props |=  DONOR_PROP;
                       newH->props &= ~ACCEPTOR_PROP; /* donor, not acceptor */

                       /* *** adding an atom not in input! *** */
                       addNeighbor(newH, (usesMovingAtoms ? bbins : abins));

                       if (DumpNewHO)
                       {
                          if (DebugLevel>3)
                          {
                             fprintf(stderr,
"HETATM%5d  H%-2d%c%3.3s%s%4.4s%c   %8.3f%8.3f%8.3f%6.2f%6.2f      new  H\n",
                                0, ++newHcount, newH->altConf,
                                newH->r->resname, newH->r->chain,
                                newH->r->Hy36resno, newH->r->resInsCode,
                                newH->loc.x, newH->loc.y, newH->loc.z,
                                newH->occ, newH->bval);
                          }
                          fprintf(outf, "{%4.4s%c%3.3s%s%4.4s%c}P %8.3f%8.3f%8.3f\n",
                             orig->atomname, orig->altConf,
                             orig->r->resname, orig->r->chain,
                             orig->r->Hy36resno, orig->r->resInsCode,
                             orig->loc.x, orig->loc.y, orig->loc.z);
                          fprintf(outf, "{%4.4s%c%3.3s%s%4s%c}L %8.3f%8.3f%8.3f\n",
                             newH->atomname, newH->altConf,
                             newH->r->resname, newH->r->chain,
                             newH->r->Hy36resno, newH->r->resInsCode,
                             newH->loc.x, newH->loc.y, newH->loc.z);
                       }

                       if (! usesMovingAtoms)
                       {
                          src = src->next; /* bypass new atom when we iterate */
                                           /* when inserted after src atom    */
                       }
                    }/*newH allocated, set its parameters*/
                 }/*close acceptor! Make a phantom H in the direction of each Acceptor*/
              }/*scan over neighbors*/

            }/* water O without occupied Hs */
         }/* else if water */ /* fixup water oxygen */

         /* non-water polar (N/O/S) atoms in selection list */
         else if (    (src->flags & selectedFlag) && !(src->props & WATER_PROP)
                  &&  (src->elem == atomN || src->elem == atomO || src->elem == atomS))
         {
            /* Remove any DONOR property for non-water non-H            */
            /* polar atoms since the Hydrogen atoms will be the DONORs. */
            /* This was assigned in select.c to facilitate selections.  */

            src->props &= ~DONOR_PROP;
         }
      }/*loop over src atoms */ /* end loop over list of src atoms*/
   }/* loop over both lists of atoms */

   if (tempStaticList)
   {/* new hydrogens for MainAtoms when usesMovingAtoms */
      for(src = allMovingAtoms; src; src = src->next)
      {
         if (src->next == NULL)
         {
            src->next = tempStaticList;
            break; /* make sure we don't continually loop */
         }
      }
   }
   return mainWaterStorage;
}